

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_decode_init(lzx_stream *strm,wchar_t w_bits)

{
  wchar_t wVar1;
  wchar_t wVar2;
  lzx_dec *plVar3;
  uchar *puVar4;
  lzx_pos_tbl *plVar5;
  wchar_t local_8c;
  int iStack_88;
  wchar_t n;
  wchar_t base_inc [18];
  wchar_t local_38;
  wchar_t footer;
  wchar_t base;
  wchar_t w_slot;
  wchar_t w_size;
  wchar_t slot;
  lzx_dec *ds;
  wchar_t w_bits_local;
  lzx_stream *strm_local;
  
  if (strm->ds == (lzx_dec *)0x0) {
    plVar3 = (lzx_dec *)calloc(1,0x260);
    strm->ds = plVar3;
    if (strm->ds == (lzx_dec *)0x0) {
      return L'\xffffffe2';
    }
  }
  plVar3 = strm->ds;
  plVar3->error = L'\xffffffe7';
  if ((w_bits < L'\x0f') || (L'\x15' < w_bits)) {
    return L'\xffffffe7';
  }
  plVar3->error = L'\xffffffe2';
  wVar2 = plVar3->w_size;
  wVar1 = slots[w_bits + L'\xfffffff1'];
  plVar3->w_size = 1 << ((byte)w_bits & 0x1f);
  plVar3->w_mask = plVar3->w_size + L'\xffffffff';
  if ((plVar3->w_buff == (uchar *)0x0) || (wVar2 != plVar3->w_size)) {
    free(plVar3->w_buff);
    puVar4 = (uchar *)malloc((long)plVar3->w_size);
    plVar3->w_buff = puVar4;
    if (plVar3->w_buff == (uchar *)0x0) {
      return L'\xffffffe2';
    }
    free(plVar3->pos_tbl);
    plVar5 = (lzx_pos_tbl *)malloc((long)wVar1 << 3);
    plVar3->pos_tbl = plVar5;
    if (plVar3->pos_tbl == (lzx_pos_tbl *)0x0) {
      return L'\xffffffe2';
    }
    lzx_huffman_free(&plVar3->mt);
  }
  for (base_inc[0x11] = L'\0'; base_inc[0x11] < L'\x12'; base_inc[0x11] = base_inc[0x11] + L'\x01')
  {
    (&iStack_88)[base_inc[0x11]] = 1 << ((byte)base_inc[0x11] & 0x1f);
  }
  base_inc[0x11] = L'\0';
  local_38 = L'\0';
  for (w_slot = L'\0'; w_slot < wVar1; w_slot = w_slot + L'\x01') {
    if (base_inc[0x11] == L'\0') {
      local_38 = w_slot;
    }
    else {
      local_38 = (&iStack_88)[base_inc[0x11]] + local_38;
    }
    if (base_inc[0x11] < L'\x11') {
      base_inc[0x11] = L'\xfffffffe';
      for (local_8c = local_38; local_8c != L'\0'; local_8c = local_8c >> 1) {
        base_inc[0x11] = base_inc[0x11] + L'\x01';
      }
      if (base_inc[0x11] < L'\x01') {
        base_inc[0x11] = L'\0';
      }
    }
    plVar3->pos_tbl[w_slot].base = local_38;
    plVar3->pos_tbl[w_slot].footer_bits = base_inc[0x11];
  }
  plVar3->w_pos = L'\0';
  plVar3->state = L'\0';
  (plVar3->br).cache_buffer = 0;
  (plVar3->br).cache_avail = L'\0';
  plVar3->r2 = L'\x01';
  plVar3->r1 = L'\x01';
  plVar3->r0 = L'\x01';
  wVar2 = lzx_huffman_init(&plVar3->at,8,L'\b');
  if (wVar2 == L'\0') {
    wVar2 = lzx_huffman_init(&plVar3->pt,0x14,L'\n');
    if (wVar2 == L'\0') {
      wVar2 = lzx_huffman_init(&plVar3->mt,(long)(wVar1 * 8 + 0x100),L'\x10');
      if (wVar2 == L'\0') {
        wVar2 = lzx_huffman_init(&plVar3->lt,0xf9,L'\x10');
        if (wVar2 == L'\0') {
          plVar3->error = L'\0';
          strm_local._4_4_ = L'\0';
        }
        else {
          strm_local._4_4_ = L'\xffffffe2';
        }
      }
      else {
        strm_local._4_4_ = L'\xffffffe2';
      }
    }
    else {
      strm_local._4_4_ = L'\xffffffe2';
    }
  }
  else {
    strm_local._4_4_ = L'\xffffffe2';
  }
  return strm_local._4_4_;
}

Assistant:

static int
lzx_decode_init(struct lzx_stream *strm, int w_bits)
{
	struct lzx_dec *ds;
	int slot, w_size, w_slot;
	int base, footer;
	int base_inc[18];

	if (strm->ds == NULL) {
		strm->ds = calloc(1, sizeof(*strm->ds));
		if (strm->ds == NULL)
			return (ARCHIVE_FATAL);
	}
	ds = strm->ds;
	ds->error = ARCHIVE_FAILED;

	/* Allow bits from 15(32KBi) up to 21(2MBi) */
	if (w_bits < SLOT_BASE || w_bits > SLOT_MAX)
		return (ARCHIVE_FAILED);

	ds->error = ARCHIVE_FATAL;

	/*
	 * Alloc window
	 */
	w_size = ds->w_size;
	w_slot = slots[w_bits - SLOT_BASE];
	ds->w_size = 1U << w_bits;
	ds->w_mask = ds->w_size -1;
	if (ds->w_buff == NULL || w_size != ds->w_size) {
		free(ds->w_buff);
		ds->w_buff = malloc(ds->w_size);
		if (ds->w_buff == NULL)
			return (ARCHIVE_FATAL);
		free(ds->pos_tbl);
		ds->pos_tbl = malloc(sizeof(ds->pos_tbl[0]) * w_slot);
		if (ds->pos_tbl == NULL)
			return (ARCHIVE_FATAL);
		lzx_huffman_free(&(ds->mt));
	}

	for (footer = 0; footer < 18; footer++)
		base_inc[footer] = 1 << footer;
	base = footer = 0;
	for (slot = 0; slot < w_slot; slot++) {
		int n;
		if (footer == 0)
			base = slot;
		else
			base += base_inc[footer];
		if (footer < 17) {
			footer = -2;
			for (n = base; n; n >>= 1)
				footer++;
			if (footer <= 0)
				footer = 0;
		}
		ds->pos_tbl[slot].base = base;
		ds->pos_tbl[slot].footer_bits = footer;
	}

	ds->w_pos = 0;
	ds->state = 0;
	ds->br.cache_buffer = 0;
	ds->br.cache_avail = 0;
	ds->r0 = ds->r1 = ds->r2 = 1;

	/* Initialize aligned offset tree. */
	if (lzx_huffman_init(&(ds->at), 8, 8) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Initialize pre-tree. */
	if (lzx_huffman_init(&(ds->pt), 20, 10) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Initialize Main tree. */
	if (lzx_huffman_init(&(ds->mt), 256+(w_slot<<3), 16)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Initialize Length tree. */
	if (lzx_huffman_init(&(ds->lt), 249, 16) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	ds->error = 0;

	return (ARCHIVE_OK);
}